

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Graph * Omega_h::invert_map_by_atomics
                  (Graph *__return_storage_ptr__,LOs *a2b,LO nb,string *b2ba_name,string *ba2a_name)

{
  int *piVar1;
  int iVar2;
  Alloc *pAVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_2;
  allocator local_1c9;
  LOs ba2a;
  Write<int> local_1b8;
  Write<int> local_1a8;
  Write<int> local_198;
  LOs b2ba;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Write<int> write_ba2a;
  Write<int> degrees;
  type fill;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<int> local_b0;
  Write<int> positions;
  Write<int> local_90;
  Write<int> local_80;
  type count;
  ScopedTimer omega_h_scoped_function_timer_1;
  
  std::__cxx11::string::string
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,(allocator *)&omega_h_scoped_function_timer_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fill,
                 &local_158,":");
  std::__cxx11::to_string(&local_178,0xf0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ba2a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fill,
                 &local_178);
  begin_code("invert_map_by_atomics",(char *)ba2a.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&ba2a);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&fill);
  std::__cxx11::string::~string((string *)&local_158);
  pAVar3 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar6 = pAVar3->size;
  }
  else {
    uVar6 = (ulong)pAVar3 >> 3;
  }
  std::__cxx11::string::string((string *)&ba2a,"",(allocator *)&fill);
  Write<int>::Write(&degrees,nb,0,(string *)&ba2a);
  std::__cxx11::string::~string((string *)&ba2a);
  Write<int>::Write((Write<int> *)&count,&a2b->write_);
  Write<int>::Write(&count.degrees,&degrees);
  std::__cxx11::string::string
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,(allocator *)&b2ba);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fill,
                 &local_158,":");
  std::__cxx11::to_string(&local_178,0x54);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ba2a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fill,
                 &local_178);
  begin_code("parallel_for",(char *)ba2a.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&ba2a);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&fill);
  std::__cxx11::string::~string((string *)&local_158);
  uVar5 = (uint)(uVar6 >> 2);
  if (0 < (int)uVar5) {
    entering_parallel = 1;
    Write<int>::Write(&ba2a.write_,(Write<int> *)&count);
    Write<int>::Write(&local_1b8,&count.degrees);
    entering_parallel = 0;
    for (uVar6 = 0; (uVar5 & 0x7fffffff) != uVar6; uVar6 = uVar6 + 1) {
      piVar1 = (int *)((long)local_1b8.shared_alloc_.direct_ptr +
                      (long)*(int *)((long)ba2a.write_.shared_alloc_.direct_ptr + uVar6 * 4) * 4);
      *piVar1 = *piVar1 + 1;
    }
    invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::~__0((__0 *)&ba2a);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  Write<int>::Write(&local_90,&degrees);
  Read<int>::Read((Read<signed_char> *)&local_80,&local_90);
  offset_scan<int>((Omega_h *)&b2ba,(Read<int> *)&local_80,b2ba_name);
  Write<int>::~Write(&local_80);
  Write<int>::~Write(&local_90);
  iVar4 = Read<int>::get((Read<signed_char> *)&b2ba,nb);
  Write<int>::Write(&write_ba2a,iVar4,ba2a_name);
  std::__cxx11::string::string((string *)&ba2a,"",(allocator *)&fill);
  Write<int>::Write(&positions,nb,0,(string *)&ba2a);
  std::__cxx11::string::~string((string *)&ba2a);
  Write<int>::Write((Write<int> *)&fill,&a2b->write_);
  Write<int>::Write(&fill.b2ba.write_,&b2ba.write_);
  Write<int>::Write(&fill.positions,&positions);
  Write<int>::Write(&fill.write_ba2a,&write_ba2a);
  std::__cxx11::string::string
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_1c9);
  std::operator+(&local_158,&local_178,":");
  std::__cxx11::to_string((string *)&omega_h_scoped_function_timer_1,0x54);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ba2a,
                 &local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &omega_h_scoped_function_timer_1);
  begin_code("parallel_for",(char *)ba2a.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&ba2a);
  std::__cxx11::string::~string((string *)&omega_h_scoped_function_timer_1);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  if (0 < (int)uVar5) {
    entering_parallel = 1;
    Write<int>::Write(&ba2a.write_,(Write<int> *)&fill);
    Write<int>::Write(&local_1b8,&fill.b2ba.write_);
    Write<int>::Write(&local_1a8,&fill.positions);
    Write<int>::Write(&local_198,&fill.write_ba2a);
    entering_parallel = 0;
    for (uVar6 = 0; (uVar5 & 0x7fffffff) != uVar6; uVar6 = uVar6 + 1) {
      lVar7 = (long)*(int *)((long)ba2a.write_.shared_alloc_.direct_ptr + uVar6 * 4);
      iVar4 = *(int *)((long)local_1b8.shared_alloc_.direct_ptr + lVar7 * 4);
      iVar2 = *(int *)((long)local_1a8.shared_alloc_.direct_ptr + lVar7 * 4);
      *(int *)((long)local_1a8.shared_alloc_.direct_ptr + lVar7 * 4) = iVar2 + 1;
      *(int *)((long)local_198.shared_alloc_.direct_ptr + ((long)iVar4 + (long)iVar2) * 4) =
           (int)uVar6;
    }
    invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_1::~__1((__1 *)&ba2a);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_2);
  Write<int>::Write(&local_b0,&write_ba2a);
  Read<int>::Read((Read<signed_char> *)&ba2a,&local_b0);
  Write<int>::~Write(&local_b0);
  Write<int>::Write(&local_c0,&b2ba.write_);
  Write<int>::Write(&local_d0,&ba2a.write_);
  Graph::Graph(__return_storage_ptr__,(LOs *)&local_c0,(LOs *)&local_d0);
  Write<int>::~Write(&local_d0);
  Write<int>::~Write(&local_c0);
  Write<int>::~Write(&ba2a.write_);
  invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_1::~__1((__1 *)&fill);
  Write<int>::~Write(&positions);
  Write<int>::~Write(&write_ba2a);
  Write<int>::~Write(&b2ba.write_);
  invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&count);
  Write<int>::~Write(&degrees);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

Graph invert_map_by_atomics(LOs const a2b, LO const nb,
    std::string const& b2ba_name, std::string const& ba2a_name) {
  OMEGA_H_TIME_FUNCTION;
  auto const na = a2b.size();
  Write<LO> degrees(nb, 0);
  auto count = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    atomic_increment(&degrees[b]);
  };
  parallel_for(na, std::move(count));
  auto const b2ba = offset_scan(Read<LO>(degrees), b2ba_name);
  auto const nba = b2ba.get(nb);
  Write<LO> write_ba2a(nba, ba2a_name);
  auto const positions = Write<LO>(nb, 0);
  auto fill = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    auto const first = b2ba[b];
    auto const j = atomic_fetch_add(&positions[b], 1);
    write_ba2a[first + j] = a;
  };
  parallel_for(na, std::move(fill));
  auto const ba2a = LOs(write_ba2a);
  return Graph(b2ba, ba2a);
}